

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

uchar getUnOpcode(TokenType type)

{
  ostream *poVar1;
  string local_30;
  TokenType local_10;
  uchar local_9;
  TokenType type_local;
  
  switch(type) {
  case Ampersand:
    local_9 = 's';
    break;
  case Plus:
    local_9 = 'q';
    break;
  case Minus:
    local_9 = 'p';
    break;
  default:
    local_10 = type;
    poVar1 = std::operator<<((ostream *)&std::cout,"Token ");
    tokTypeToString_abi_cxx11_(&local_30,local_10);
    poVar1 = std::operator<<(poVar1,(string *)&local_30);
    poVar1 = std::operator<<(poVar1," has no unary opcode translation.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    exit(1);
  case Bang:
    local_9 = 'r';
  }
  return local_9;
}

Assistant:

inline constexpr unsigned char getUnOpcode(TokenType type) {
    switch (type) {
        case TokenType::Plus:
            return Opcode::POS;
        case TokenType::Minus:
            return Opcode::NEG;
        case TokenType::Bang:
            return Opcode::NOT;
        case TokenType::Ampersand:
            return Opcode::STRFY;
        default:
            // this should never happen
            std::cout << "Token " << tokTypeToString(type) << " has no unary opcode translation." << std::endl;
            exit(1);
    }
}